

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall
nuraft::rpc_session::read_complete(rpc_session *this,ptr<buffer> *hdr,ptr<buffer> *log_ctx)

{
  byte bVar1;
  bool bVar2;
  undefined1 uVar3;
  int32 iVar4;
  int32 leader_id;
  int32_t iVar5;
  int iVar6;
  element_type *this_00;
  element_type *this_01;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  element_type *this_02;
  ulong uVar11;
  options *poVar12;
  element_type *peVar13;
  __shared_ptr *in_RDX;
  long in_RDI;
  exception *ex;
  ptr<cmd_result<ptr<buffer>_>_> ret;
  ptr<resp_msg> resp;
  ptr<log_entry> entry;
  ptr<buffer> buf;
  size_t val_size;
  uint64_t timestamp;
  log_val_type val_type;
  ulong term_1;
  size_t LOG_ENTRY_SIZE;
  byte *meta_raw;
  size_t meta_len;
  size_t log_ctx_size;
  buffer_serializer ss;
  ptr<req_msg> req;
  string meta_str;
  Param cb_param;
  ConnectionArgs args;
  ulong commit_idx;
  ulong last_idx;
  ulong last_term;
  ulong term;
  int32 dst;
  int32 src;
  msg_type t;
  ptr<rpc_session> self;
  raft_server *in_stack_fffffffffffffb38;
  resp_msg *this_03;
  Param *in_stack_fffffffffffffb40;
  req_msg *req_00;
  int32_t in_stack_fffffffffffffb48;
  Type in_stack_fffffffffffffb4c;
  raft_server *in_stack_fffffffffffffb50;
  handler_type2 *in_stack_fffffffffffffb58;
  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
  *in_stack_fffffffffffffb60;
  unsigned_long *in_stack_fffffffffffffb68;
  rpc_session *in_stack_fffffffffffffb70;
  ptr<resp_msg> *_resp;
  undefined7 in_stack_fffffffffffffb78;
  buffer *in_stack_fffffffffffffb80;
  undefined7 in_stack_fffffffffffffb88;
  undefined1 in_stack_fffffffffffffb8f;
  undefined8 in_stack_fffffffffffffba8;
  undefined7 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb7;
  uint64_t local_400;
  undefined4 in_stack_fffffffffffffc88;
  ptr<resp_msg> *in_stack_fffffffffffffd40;
  ptr<req_msg> *in_stack_fffffffffffffd48;
  rpc_session *in_stack_fffffffffffffd50;
  string local_258 [80];
  ptr<resp_msg> local_208 [6];
  string local_1a8 [32];
  ulong local_188;
  uint64_t local_180;
  uint8_t local_171;
  uint64_t local_170;
  int local_164;
  string local_160 [32];
  ulong local_140;
  allocator local_131;
  string local_130 [32];
  char *local_110;
  ulong local_108;
  size_t local_100;
  buffer_serializer local_f8;
  string local_d0 [32];
  Param local_b0;
  undefined1 local_98 [56];
  undefined1 local_60 [16];
  ulong local_50;
  ulong local_48;
  int32 local_40;
  int32 local_3c;
  uint local_38;
  
  uVar3 = (undefined1)((ulong)in_stack_fffffffffffffba8 >> 0x38);
  std::enable_shared_from_this<nuraft::rpc_session>::shared_from_this
            ((enable_shared_from_this<nuraft::rpc_session> *)in_stack_fffffffffffffb38);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x29d8e9);
  nuraft::buffer::pos((buffer *)in_stack_fffffffffffffb60,(size_t)in_stack_fffffffffffffb58);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x29d905);
  bVar1 = nuraft::buffer::get_byte((buffer *)in_stack_fffffffffffffb60);
  local_38 = (uint)bVar1;
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x29d934);
  local_3c = nuraft::buffer::get_int(in_stack_fffffffffffffb80);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x29d960);
  local_40 = nuraft::buffer::get_int(in_stack_fffffffffffffb80);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x29d98c);
  local_48 = nuraft::buffer::get_ulong(in_stack_fffffffffffffb80);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x29d9bb);
  local_50 = nuraft::buffer::get_ulong(in_stack_fffffffffffffb80);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x29d9ea);
  local_60._8_8_ = nuraft::buffer::get_ulong(in_stack_fffffffffffffb80);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x29da19);
  local_60._0_8_ = nuraft::buffer::get_ulong(in_stack_fffffffffffffb80);
  if (*(int *)(in_RDI + 0x248) == -1) {
    *(int32 *)(in_RDI + 0x248) = local_3c;
    invoke_connection_callback
              ((rpc_session *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
               (bool)uVar3);
  }
  else if ((*(byte *)(in_RDI + 0x24c) & 1) != 0) {
    iVar6 = *(int *)(in_RDI + 0x248);
    std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x29dab7);
    iVar4 = raft_server::get_leader(in_stack_fffffffffffffb38);
    if (iVar6 != iVar4) {
      *(undefined1 *)(in_RDI + 0x24c) = 0;
    }
  }
  if (((*(byte *)(in_RDI + 0x24c) & 1) == 0) &&
     (((((local_38 == 3 || (local_38 == 10)) || (local_38 == 0xc)) ||
       ((local_38 == 0xe || (local_38 == 0x10)))) || ((local_38 == 0x18 || (local_38 == 0x1c)))))) {
    *(undefined1 *)(in_RDI + 0x24c) = 1;
    cb_func::ConnectionArgs::ConnectionArgs
              ((ConnectionArgs *)in_stack_fffffffffffffb60,(uint64_t)in_stack_fffffffffffffb58,
               (string *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
               in_stack_fffffffffffffb48,SUB81((ulong)in_stack_fffffffffffffb40 >> 0x38,0));
    this_00 = std::
              __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x29db9a);
    iVar4 = raft_server::get_id(this_00);
    std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x29dbb6);
    leader_id = raft_server::get_leader(in_stack_fffffffffffffb38);
    cb_func::Param::Param(&local_b0,iVar4,leader_id,-1,local_98);
    std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x29dbf4);
    raft_server::invoke_callback
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,in_stack_fffffffffffffb40);
    cb_func::ConnectionArgs::~ConnectionArgs((ConnectionArgs *)0x29dc18);
  }
  std::__cxx11::string::string(local_d0);
  req_00 = (req_msg *)local_60;
  this_03 = (resp_msg *)(local_60 + 8);
  cs_new<nuraft::req_msg,unsigned_long&,nuraft::msg_type&,int&,int&,unsigned_long&,unsigned_long&,unsigned_long&>
            (in_stack_fffffffffffffb68,(msg_type *)in_stack_fffffffffffffb60,
             (int *)in_stack_fffffffffffffb58,(int *)in_stack_fffffffffffffb50,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
             (unsigned_long *)in_stack_fffffffffffffb80,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88));
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x29dcad);
  iVar4 = nuraft::buffer::get_int(in_stack_fffffffffffffb80);
  if ((0 < iVar4) && (bVar2 = std::__shared_ptr::operator_cast_to_bool(in_RDX), bVar2)) {
    buffer_serializer::buffer_serializer
              ((buffer_serializer *)in_stack_fffffffffffffb50,
               (ptr<buffer> *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
               (endianness)((ulong)req_00 >> 0x20));
    this_01 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x29dd0a);
    local_100 = nuraft::buffer::size(this_01);
    if ((*(uint *)(in_RDI + 500) & 1) != 0) {
      local_108 = 0;
      pcVar7 = (char *)buffer_serializer::get_bytes
                                 ((buffer_serializer *)in_stack_fffffffffffffb60,
                                  (size_t *)in_stack_fffffffffffffb58);
      uVar11 = local_108;
      local_110 = pcVar7;
      if (local_108 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_130,pcVar7,uVar11,&local_131);
        std::__cxx11::string::operator=(local_d0,local_130);
        std::__cxx11::string::~string(local_130);
        std::allocator<char>::~allocator((allocator<char> *)&local_131);
      }
    }
    local_140 = 0xd;
    if ((*(uint *)(in_RDI + 500) & 4) != 0) {
      local_140 = 0x15;
    }
    while (sVar9 = local_100, sVar8 = buffer_serializer::pos(&local_f8), sVar10 = local_100,
          sVar8 < sVar9) {
      sVar9 = buffer_serializer::pos(&local_f8);
      if (sVar10 - sVar9 < local_140) {
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x218));
        if (bVar2) {
          peVar13 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x29df68);
          iVar6 = (**(code **)(*(long *)peVar13 + 0x38))();
          if (2 < iVar6) {
            peVar13 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x29dfa1);
            sVar9 = local_100;
            sVar10 = buffer_serializer::pos(&local_f8);
            msg_if_given_abi_cxx11_
                      ((char *)local_160,"wrong log ctx size %zu pos %zu, stop this session",sVar9,
                       sVar10);
            (**(code **)(*(long *)peVar13 + 0x40))
                      (peVar13,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                       ,"read_complete",0x21b,local_160);
            std::__cxx11::string::~string(local_160);
          }
        }
        stop(in_stack_fffffffffffffb70);
        local_164 = 1;
        goto LAB_0029e8fc;
      }
      local_170 = buffer_serializer::get_u64((buffer_serializer *)in_stack_fffffffffffffb70);
      local_171 = buffer_serializer::get_u8((buffer_serializer *)in_stack_fffffffffffffb60);
      if ((*(uint *)(in_RDI + 500) & 4) == 0) {
        local_400 = 0;
      }
      else {
        local_400 = buffer_serializer::get_u64((buffer_serializer *)in_stack_fffffffffffffb70);
      }
      local_180 = local_400;
      iVar5 = buffer_serializer::get_i32((buffer_serializer *)in_stack_fffffffffffffb70);
      sVar9 = local_100;
      local_188 = (ulong)iVar5;
      sVar10 = buffer_serializer::pos(&local_f8);
      if (sVar9 - sVar10 < local_188) {
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x218));
        if (bVar2) {
          peVar13 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x29e1c6);
          iVar6 = (**(code **)(*(long *)peVar13 + 0x38))();
          if (2 < iVar6) {
            peVar13 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x29e1ff);
            sVar9 = local_100;
            uVar11 = local_188;
            sVar10 = buffer_serializer::pos(&local_f8);
            msg_if_given_abi_cxx11_
                      ((char *)local_1a8,"wrong value size %zu log ctx %zu %zu, stop this session",
                       uVar11,sVar9,sVar10);
            (**(code **)(*(long *)peVar13 + 0x40))
                      (peVar13,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                       ,"read_complete",0x228,local_1a8);
            std::__cxx11::string::~string(local_1a8);
          }
        }
        stop(in_stack_fffffffffffffb70);
        local_164 = 1;
        goto LAB_0029e8fc;
      }
      nuraft::buffer::alloc(CONCAT44(iVar4,in_stack_fffffffffffffc88));
      buffer_serializer::get_buffer
                ((buffer_serializer *)in_stack_fffffffffffffb60,
                 (ptr<buffer> *)in_stack_fffffffffffffb58);
      cs_new<nuraft::log_entry,unsigned_long&,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type&,unsigned_long&>
                ((unsigned_long *)in_stack_fffffffffffffb58,
                 (shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffb50,
                 (log_val_type *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                 (unsigned_long *)req_00);
      this_02 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x29e360);
      req_msg::log_entries(this_02);
      std::
      vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ::push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   *)in_stack_fffffffffffffb50,
                  (value_type *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x29e387);
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x29e394);
    }
  }
  asio_service_impl::get_options(*(asio_service_impl **)(in_RDI + 0x18));
  bVar2 = std::function::operator_cast_to_bool
                    ((function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)0x29e404);
  if ((bVar2) &&
     ((uVar11 = std::__cxx11::string::empty(), (uVar11 & 1) == 0 ||
      (poVar12 = asio_service_impl::get_options(*(asio_service_impl **)(in_RDI + 0x18)),
      (poVar12->invoke_req_cb_on_empty_meta_ & 1U) != 0)))) {
    asio_service_impl::get_options(*(asio_service_impl **)(in_RDI + 0x18));
    req_to_params((ptr<req_msg> *)in_stack_fffffffffffffb80);
    bVar2 = std::
            function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()((function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)in_stack_fffffffffffffb50,
                         (asio_service_meta_cb_params *)
                         CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)req_00
                        );
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      stop(in_stack_fffffffffffffb70);
      local_164 = 1;
      goto LAB_0029e8fc;
    }
  }
  std::__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>::get
            ((__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 0x20));
  std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             req_00);
  raft_server::req_ext_params::req_ext_params((req_ext_params *)req_00);
  raft_server_handler::process_req
            ((raft_server *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),req_00,
             (req_ext_params *)this_03);
  raft_server::req_ext_params::~req_ext_params((req_ext_params *)0x29e529);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_208);
  if (bVar2) {
    std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x29e690);
    bVar2 = resp_msg::has_async_cb(this_03);
    if (bVar2) {
      std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x29e6b8);
      resp_msg::call_async_cb(this_03);
      std::
      __shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x29e6d7);
      std::shared_ptr<nuraft::rpc_session>::shared_ptr
                ((shared_ptr<nuraft::rpc_session> *)req_00,
                 (shared_ptr<nuraft::rpc_session> *)this_03);
      std::shared_ptr<nuraft::req_msg>::shared_ptr
                ((shared_ptr<nuraft::req_msg> *)req_00,(shared_ptr<nuraft::req_msg> *)this_03);
      std::shared_ptr<nuraft::resp_msg>::shared_ptr
                ((shared_ptr<nuraft::resp_msg> *)req_00,(shared_ptr<nuraft::resp_msg> *)this_03);
      std::
      function<void(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>&,std::shared_ptr<std::exception>&)>
      ::
      function<nuraft::rpc_session::read_complete(std::shared_ptr<nuraft::buffer>,std::shared_ptr<nuraft::buffer>)::_lambda(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>&,std::shared_ptr<std::exception>&)_1_,void>
                ((function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_&,_std::shared_ptr<std::exception>_&)>
                  *)in_stack_fffffffffffffb50,
                 (anon_class_56_4_aa7ddfaa *)
                 CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::when_ready
                (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      std::
      function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_&,_std::shared_ptr<std::exception>_&)>
      ::~function((function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_&,_std::shared_ptr<std::exception>_&)>
                   *)0x29e766);
      read_complete(std::shared_ptr<nuraft::buffer>,std::shared_ptr<nuraft::buffer>)::
      {lambda(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>&,std::shared_ptr<std::exception>&)#1}
      ::~cmd_result((anon_class_56_4_aa7ddfaa *)req_00);
      std::
      shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
      ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                     *)0x29e780);
    }
    else {
      std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x29e7e8);
      uVar3 = resp_msg::has_cb(this_03);
      if ((bool)uVar3) {
        _resp = local_208;
        std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x29e812);
        resp_msg::call_cb((resp_msg *)CONCAT17(uVar3,in_stack_fffffffffffffb78),_resp);
        std::shared_ptr<nuraft::resp_msg>::operator=
                  ((shared_ptr<nuraft::resp_msg> *)req_00,(shared_ptr<nuraft::resp_msg> *)this_03);
        std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x29e84b);
      }
      std::shared_ptr<nuraft::req_msg>::shared_ptr
                ((shared_ptr<nuraft::req_msg> *)req_00,(shared_ptr<nuraft::req_msg> *)this_03);
      std::shared_ptr<nuraft::resp_msg>::shared_ptr
                ((shared_ptr<nuraft::resp_msg> *)req_00,(shared_ptr<nuraft::resp_msg> *)this_03);
      on_resp_ready(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
      std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x29e8a5);
      std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x29e8b2);
    }
    local_164 = 0;
  }
  else {
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x218));
    if (bVar2) {
      peVar13 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x29e56f);
      iVar6 = (**(code **)(*(long *)peVar13 + 0x38))();
      if (2 < iVar6) {
        peVar13 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x29e5a2);
        msg_if_given_abi_cxx11_
                  ((char *)local_258,"no response is returned from raft message handler");
        (**(code **)(*(long *)peVar13 + 0x40))
                  (peVar13,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"read_complete",0x244,local_258);
        std::__cxx11::string::~string(local_258);
      }
    }
    stop(in_stack_fffffffffffffb70);
    local_164 = 1;
  }
  std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x29e8fc);
LAB_0029e8fc:
  std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x29e909);
  std::__cxx11::string::~string(local_d0);
  if (local_164 == 0) {
    local_164 = 0;
  }
  std::shared_ptr<nuraft::rpc_session>::~shared_ptr((shared_ptr<nuraft::rpc_session> *)0x29ead3);
  return;
}

Assistant:

void read_complete(ptr<buffer> hdr, ptr<buffer> log_ctx) {
        ptr<rpc_session> self = this->shared_from_this();

       try {
        hdr->pos(1);
        msg_type t = (msg_type)hdr->get_byte();
        int32 src = hdr->get_int();
        int32 dst = hdr->get_int();
        ulong term = hdr->get_ulong();
        ulong last_term = hdr->get_ulong();
        ulong last_idx = hdr->get_ulong();
        ulong commit_idx = hdr->get_ulong();

        if (src_id_ == -1) {
            // It means this is the first message on this session.
            // Invoke callback function of new connection.
            src_id_ = src;
            invoke_connection_callback(true);

        } else if (is_leader_ && src_id_ != handler_->get_leader()) {
            // Leader has been changed without closing session.
            is_leader_ = false;
        }

        if (!is_leader_) {
            // If leader flag is not set, we identify whether the endpoint
            // server is leader based on the message type (only leader
            // can send below message types).
            if ( t == msg_type::append_entries_request ||
                 t == msg_type::sync_log_request ||
                 t == msg_type::join_cluster_request ||
                 t == msg_type::leave_cluster_request ||
                 t == msg_type::install_snapshot_request ||
                 t == msg_type::priority_change_request ||
                 t == msg_type::custom_notification_request ) {
                is_leader_ = true;
                cb_func::ConnectionArgs
                    args( session_id_,
                          cached_address_,
                          cached_port_,
                          src_id_,
                          is_leader_ );
                cb_func::Param cb_param( handler_->get_id(),
                                         handler_->get_leader(),
                                         -1,
                                         &args );
                handler_->invoke_callback( cb_func::NewSessionFromLeader,
                                           &cb_param );
            }
        }

        std::string meta_str;
        ptr<req_msg> req = cs_new<req_msg>
                           ( term, t, src, dst, last_term, last_idx, commit_idx );
        if (hdr->get_int() > 0 && log_ctx) {
            buffer_serializer ss(log_ctx);
            size_t log_ctx_size = log_ctx->size();

            // If flag is set, read meta first.
            if (flags_ & INCLUDE_META) {
                size_t meta_len = 0;
                const byte* meta_raw = (const byte*)ss.get_bytes(meta_len);
                if (meta_len) {
                    meta_str = std::string((const char*)meta_raw, meta_len);
                }
            }

            size_t LOG_ENTRY_SIZE = 8 + 1 + 4;
            if (flags_ & INCLUDE_LOG_TIMESTAMP) {
                LOG_ENTRY_SIZE += 8;
            }

            while (log_ctx_size > ss.pos()) {
                if (log_ctx_size - ss.pos() < LOG_ENTRY_SIZE) {
                    // Possibly corrupted packet. Stop here.
                    p_wn("wrong log ctx size %zu pos %zu, stop this session",
                         log_ctx_size, ss.pos());
                    this->stop();
                    return;
                }
                ulong term = ss.get_u64();
                log_val_type val_type = (log_val_type)ss.get_u8();
                uint64_t timestamp = (flags_ & INCLUDE_LOG_TIMESTAMP) ? ss.get_u64() : 0;

                size_t val_size = ss.get_i32();
                if (log_ctx_size - ss.pos() < val_size) {
                    // Out-of-bound size.
                    p_wn("wrong value size %zu log ctx %zu %zu, "
                         "stop this session",
                         val_size, log_ctx_size, ss.pos());
                    this->stop();
                    return;
                }

                ptr<buffer> buf( buffer::alloc(val_size) );
                ss.get_buffer(buf);
                ptr<log_entry> entry(
                    cs_new<log_entry>(term, buf, val_type, timestamp) );
                req->log_entries().push_back(entry);
            }
        }

        // If callback is given, verify meta
        // (if meta is empty, invoke callback according to the flag).
        if ( impl_->get_options().read_req_meta_ &&
             ( !meta_str.empty() ||
               impl_->get_options().invoke_req_cb_on_empty_meta_ ) ) {
            if ( !impl_->get_options().read_req_meta_
                  ( req_to_params(req), meta_str ) ) {
                this->stop();
                return;
            }
        }

        // === RAFT server processes the request here. ===
        ptr<resp_msg> resp = raft_server_handler::process_req(handler_.get(), *req);
        if (!resp) {
            p_wn("no response is returned from raft message handler");
            this->stop();
            return;
        }

        if (resp->has_async_cb()) {
            // Response will be ready later, setup a callback function
            // (only for auto-forwarding with `client_request` type
            //  in async handling mode).
            ptr< cmd_result< ptr<buffer> > > ret = resp->call_async_cb();

            // WARNING: `self` should be captured to avoid releasing this `rpc_session`.
            ret->when_ready(
                [this, self, req, resp]
                ( cmd_result<ptr<buffer>, ptr<std::exception>>& res,
                  ptr<std::exception>& exp ) {
                    resp->set_ctx(res.get());
                    on_resp_ready(req, resp);
                    // This is needed to avoid circular reference.
                    res.reset();
                }
            );

        } else {
            // Response should already be ready when we reach here.
            if (resp->has_cb()) {
                // If callback function exists, get new response message.
                resp = resp->call_cb(resp);
            }
            on_resp_ready(req, resp);
        }

       } catch (std::exception& ex) {
        p_er( "session %" PRIu64 " failed to process request message "
              "due to error: %s",
              this->session_id_,
              ex.what() );
        this->stop();
       }
    }